

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * getBlurayStreamDir(string *__return_storage_ptr__,string *mplsName)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  allocator<char> local_81;
  string local_80;
  string dirName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  extractFileDir(&dirName,mplsName);
  toNativeSeparators(&local_80,&dirName);
  std::__cxx11::string::operator=((string *)&dirName,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::substr((ulong)&local_80,(ulong)&dirName);
  cVar1 = getDirSeparator();
  lVar3 = std::__cxx11::string::rfind((char)&local_80,(ulong)(uint)(int)cVar1);
  std::__cxx11::string::~string((string *)&local_80);
  if (lVar3 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_80);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_80,(ulong)&dirName);
    std::__cxx11::string::operator=((string *)&dirName,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"BACKUP",&local_81);
    cVar1 = getDirSeparator();
    std::operator+(&local_80,&local_40,cVar1);
    bVar2 = strEndWith(&dirName,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar2) {
      std::__cxx11::string::substr((ulong)&local_80,(ulong)&dirName);
      cVar1 = getDirSeparator();
      lVar3 = std::__cxx11::string::rfind((char)&local_80,(ulong)(uint)(int)cVar1);
      std::__cxx11::string::~string((string *)&local_80);
      if (lVar3 == -1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_80);
        goto LAB_001a788b;
      }
      std::__cxx11::string::substr((ulong)&local_80,(ulong)&dirName);
      std::__cxx11::string::operator=((string *)&dirName,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"STREAM",&local_81);
    std::operator+(&local_80,&dirName,&local_40);
    cVar1 = getDirSeparator();
    std::operator+(__return_storage_ptr__,&local_80,cVar1);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
LAB_001a788b:
  std::__cxx11::string::~string((string *)&dirName);
  return __return_storage_ptr__;
}

Assistant:

string getBlurayStreamDir(const string& mplsName)
{
    string dirName = extractFileDir(mplsName);
    dirName = toNativeSeparators(dirName);
    size_t tmp = dirName.substr(0, dirName.size() - 1).find_last_of(getDirSeparator());
    if (tmp != string::npos)
    {
        dirName = dirName.substr(0, tmp + 1);
        if (strEndWith(dirName, string("BACKUP") + getDirSeparator()))
        {
            tmp = dirName.substr(0, dirName.size() - 1).find_last_of(getDirSeparator());
            if (tmp == string::npos)
                return "";
            dirName = dirName.substr(0, tmp + 1);
        }
        return dirName + string("STREAM") + getDirSeparator();
    }
    return "";
}